

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O0

void __thiscall cmComputeLinkInformation::ComputeItemParserInfo(cmComputeLinkInformation *this)

{
  cmMakefile *pcVar1;
  bool bVar2;
  char *pcVar3;
  reference pbVar4;
  string local_310;
  string local_2f0 [8];
  string reg_shared;
  string local_2b0 [8];
  string reg_static;
  string reg_any;
  _Self local_268;
  iterator p;
  undefined1 local_258 [8];
  string reg;
  string libext;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_210;
  iterator i_1;
  string local_200;
  undefined1 local_1e0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sharedSuffixVec;
  string local_1c0;
  char *local_1a0;
  char *sharedSuffixes;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_190;
  iterator i;
  string local_180;
  undefined1 local_160 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  linkSuffixVec;
  string local_140;
  char *local_120;
  char *linkSuffixes;
  string local_110;
  allocator local_e9;
  string local_e8;
  allocator local_c1;
  string local_c0;
  allocator local_99;
  string local_98;
  allocator local_71;
  string local_70;
  allocator local_39;
  string local_38;
  cmMakefile *local_18;
  cmMakefile *mf;
  cmComputeLinkInformation *this_local;
  
  pcVar1 = this->Makefile;
  local_18 = pcVar1;
  mf = (cmMakefile *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"CMAKE_STATIC_LIBRARY_PREFIX",&local_39);
  pcVar3 = cmMakefile::GetDefinition(pcVar1,&local_38);
  AddLinkPrefix(this,pcVar3);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  pcVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"CMAKE_SHARED_LIBRARY_PREFIX",&local_71);
  pcVar3 = cmMakefile::GetDefinition(pcVar1,&local_70);
  AddLinkPrefix(this,pcVar3);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  pcVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_98,"CMAKE_IMPORT_LIBRARY_SUFFIX",&local_99);
  pcVar3 = cmMakefile::GetDefinition(pcVar1,&local_98);
  AddLinkExtension(this,pcVar3,LinkShared);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  pcVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c0,"CMAKE_STATIC_LIBRARY_SUFFIX",&local_c1);
  pcVar3 = cmMakefile::GetDefinition(pcVar1,&local_c0);
  AddLinkExtension(this,pcVar3,LinkStatic);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  pcVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e8,"CMAKE_SHARED_LIBRARY_SUFFIX",&local_e9);
  pcVar3 = cmMakefile::GetDefinition(pcVar1,&local_e8);
  AddLinkExtension(this,pcVar3,LinkShared);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  pcVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_110,"CMAKE_LINK_LIBRARY_SUFFIX",(allocator *)((long)&linkSuffixes + 7)
            );
  pcVar3 = cmMakefile::GetDefinition(pcVar1,&local_110);
  AddLinkExtension(this,pcVar3,LinkUnknown);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator((allocator<char> *)((long)&linkSuffixes + 7));
  pcVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_140,"CMAKE_EXTRA_LINK_EXTENSIONS",
             (allocator *)
             ((long)&linkSuffixVec.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  pcVar3 = cmMakefile::GetDefinition(pcVar1,&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&linkSuffixVec.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  local_120 = pcVar3;
  if (pcVar3 != (char *)0x0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_160);
    pcVar3 = local_120;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_180,pcVar3,(allocator *)((long)&i._M_current + 7))
    ;
    cmSystemTools::ExpandListArgument
              (&local_180,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_160,false);
    std::__cxx11::string::~string((string *)&local_180);
    std::allocator<char>::~allocator((allocator<char> *)((long)&i._M_current + 7));
    local_190._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_160);
    while( true ) {
      sharedSuffixes =
           (char *)std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_160);
      bVar2 = __gnu_cxx::operator!=
                        (&local_190,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&sharedSuffixes);
      if (!bVar2) break;
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator->(&local_190);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      AddLinkExtension(this,pcVar3,LinkUnknown);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_190);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_160);
  }
  pcVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1c0,"CMAKE_EXTRA_SHARED_LIBRARY_SUFFIXES",
             (allocator *)
             ((long)&sharedSuffixVec.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  pcVar3 = cmMakefile::GetDefinition(pcVar1,&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&sharedSuffixVec.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  local_1a0 = pcVar3;
  if (pcVar3 != (char *)0x0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_1e0);
    pcVar3 = local_1a0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_200,pcVar3,(allocator *)((long)&i_1._M_current + 7));
    cmSystemTools::ExpandListArgument
              (&local_200,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_1e0,false);
    std::__cxx11::string::~string((string *)&local_200);
    std::allocator<char>::~allocator((allocator<char> *)((long)&i_1._M_current + 7));
    local_210._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_1e0);
    while( true ) {
      libext.field_2._8_8_ =
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_1e0);
      bVar2 = __gnu_cxx::operator!=
                        (&local_210,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)((long)&libext.field_2 + 8));
      if (!bVar2) break;
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator->(&local_210);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      AddLinkExtension(this,pcVar3,LinkShared);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_210);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1e0);
  }
  CreateExtensionRegex((string *)((long)&reg.field_2 + 8),this,&this->LinkExtensions,LinkUnknown);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_258,"(.*)",(allocator *)((long)&p._M_node + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&p._M_node + 7));
  std::__cxx11::string::operator+=((string *)local_258,(string *)(reg.field_2._M_local_buf + 8));
  cmOrderDirectories::SetLinkExtensionInfo
            (this->OrderLinkerSearchPath,&this->LinkExtensions,(string *)local_258);
  std::__cxx11::string::operator=((string *)local_258,"^(");
  local_268._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(&this->LinkPrefixes);
  while( true ) {
    reg_any.field_2._8_8_ =
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&this->LinkPrefixes);
    bVar2 = std::operator!=(&local_268,(_Self *)((long)&reg_any.field_2 + 8));
    if (!bVar2) break;
    pbVar4 = std::
             _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_268);
    std::__cxx11::string::operator+=((string *)local_258,(string *)pbVar4);
    std::__cxx11::string::operator+=((string *)local_258,"|");
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_268);
  }
  std::__cxx11::string::operator+=((string *)local_258,")");
  std::__cxx11::string::operator+=((string *)local_258,"([^/:]*)");
  std::__cxx11::string::string((string *)(reg_static.field_2._M_local_buf + 8),(string *)local_258);
  std::__cxx11::string::operator+=
            ((string *)(reg_static.field_2._M_local_buf + 8),
             (string *)(reg.field_2._M_local_buf + 8));
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cmsys::RegularExpression::compile(&this->ExtractAnyLibraryName,pcVar3);
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&this->StaticLinkExtensions);
  if (!bVar2) {
    std::__cxx11::string::string(local_2b0,(string *)local_258);
    CreateExtensionRegex
              ((string *)((long)&reg_shared.field_2 + 8),this,&this->StaticLinkExtensions,LinkStatic
              );
    std::__cxx11::string::operator+=(local_2b0,(string *)(reg_shared.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(reg_shared.field_2._M_local_buf + 8));
    pcVar3 = (char *)std::__cxx11::string::c_str();
    cmsys::RegularExpression::compile(&this->ExtractStaticLibraryName,pcVar3);
    std::__cxx11::string::~string(local_2b0);
  }
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&this->SharedLinkExtensions);
  if (!bVar2) {
    std::__cxx11::string::string(local_2f0,(string *)local_258);
    CreateExtensionRegex(&local_310,this,&this->SharedLinkExtensions,LinkShared);
    std::__cxx11::string::operator=((string *)&this->SharedRegexString,(string *)&local_310);
    std::__cxx11::string::~string((string *)&local_310);
    std::__cxx11::string::operator+=(local_2f0,(string *)&this->SharedRegexString);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    cmsys::RegularExpression::compile(&this->ExtractSharedLibraryName,pcVar3);
    std::__cxx11::string::~string(local_2f0);
  }
  std::__cxx11::string::~string((string *)(reg_static.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_258);
  std::__cxx11::string::~string((string *)(reg.field_2._M_local_buf + 8));
  return;
}

Assistant:

void cmComputeLinkInformation::ComputeItemParserInfo()
{
  // Get possible library name prefixes.
  cmMakefile* mf = this->Makefile;
  this->AddLinkPrefix(mf->GetDefinition("CMAKE_STATIC_LIBRARY_PREFIX"));
  this->AddLinkPrefix(mf->GetDefinition("CMAKE_SHARED_LIBRARY_PREFIX"));

  // Import library names should be matched and treated as shared
  // libraries for the purposes of linking.
  this->AddLinkExtension(mf->GetDefinition("CMAKE_IMPORT_LIBRARY_SUFFIX"),
                         LinkShared);
  this->AddLinkExtension(mf->GetDefinition("CMAKE_STATIC_LIBRARY_SUFFIX"),
                         LinkStatic);
  this->AddLinkExtension(mf->GetDefinition("CMAKE_SHARED_LIBRARY_SUFFIX"),
                         LinkShared);
  this->AddLinkExtension(mf->GetDefinition("CMAKE_LINK_LIBRARY_SUFFIX"),
                         LinkUnknown);
  if (const char* linkSuffixes =
        mf->GetDefinition("CMAKE_EXTRA_LINK_EXTENSIONS")) {
    std::vector<std::string> linkSuffixVec;
    cmSystemTools::ExpandListArgument(linkSuffixes, linkSuffixVec);
    for (std::vector<std::string>::iterator i = linkSuffixVec.begin();
         i != linkSuffixVec.end(); ++i) {
      this->AddLinkExtension(i->c_str(), LinkUnknown);
    }
  }
  if (const char* sharedSuffixes =
        mf->GetDefinition("CMAKE_EXTRA_SHARED_LIBRARY_SUFFIXES")) {
    std::vector<std::string> sharedSuffixVec;
    cmSystemTools::ExpandListArgument(sharedSuffixes, sharedSuffixVec);
    for (std::vector<std::string>::iterator i = sharedSuffixVec.begin();
         i != sharedSuffixVec.end(); ++i) {
      this->AddLinkExtension(i->c_str(), LinkShared);
    }
  }

  // Compute a regex to match link extensions.
  std::string libext =
    this->CreateExtensionRegex(this->LinkExtensions, LinkUnknown);

  // Create regex to remove any library extension.
  std::string reg("(.*)");
  reg += libext;
  this->OrderLinkerSearchPath->SetLinkExtensionInfo(this->LinkExtensions, reg);

  // Create a regex to match a library name.  Match index 1 will be
  // the prefix if it exists and empty otherwise.  Match index 2 will
  // be the library name.  Match index 3 will be the library
  // extension.
  reg = "^(";
  for (std::set<std::string>::iterator p = this->LinkPrefixes.begin();
       p != this->LinkPrefixes.end(); ++p) {
    reg += *p;
    reg += "|";
  }
  reg += ")";
  reg += "([^/:]*)";

  // Create a regex to match any library name.
  std::string reg_any = reg;
  reg_any += libext;
#ifdef CM_COMPUTE_LINK_INFO_DEBUG
  fprintf(stderr, "any regex [%s]\n", reg_any.c_str());
#endif
  this->ExtractAnyLibraryName.compile(reg_any.c_str());

  // Create a regex to match static library names.
  if (!this->StaticLinkExtensions.empty()) {
    std::string reg_static = reg;
    reg_static +=
      this->CreateExtensionRegex(this->StaticLinkExtensions, LinkStatic);
#ifdef CM_COMPUTE_LINK_INFO_DEBUG
    fprintf(stderr, "static regex [%s]\n", reg_static.c_str());
#endif
    this->ExtractStaticLibraryName.compile(reg_static.c_str());
  }

  // Create a regex to match shared library names.
  if (!this->SharedLinkExtensions.empty()) {
    std::string reg_shared = reg;
    this->SharedRegexString =
      this->CreateExtensionRegex(this->SharedLinkExtensions, LinkShared);
    reg_shared += this->SharedRegexString;
#ifdef CM_COMPUTE_LINK_INFO_DEBUG
    fprintf(stderr, "shared regex [%s]\n", reg_shared.c_str());
#endif
    this->ExtractSharedLibraryName.compile(reg_shared.c_str());
  }
}